

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
b_array::
Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::Array(Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,size_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  size_t *psVar4;
  size_t *psVar5;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar6;
  long lVar7;
  undefined1 local_40 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x38),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  this->data = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0;
  this->capacity = size;
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x38),8) == 0) {
    uVar2 = uVar3;
  }
  psVar4 = (size_t *)operator_new__(uVar2);
  *psVar4 = size;
  if (size != 0) {
    psVar5 = psVar4 + 3;
    lVar7 = 0;
    pPVar6 = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(psVar4 + 1);
    do {
      local_40[0] = 0;
      (pPVar6->key)._M_dataplus._M_p = (pointer)psVar5;
      std::__cxx11::string::_M_construct<char*>((string *)pPVar6,local_40,local_40);
      (pPVar6->values).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pPVar6->values).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pPVar6->values).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar7 = lVar7 + -0x38;
      pPVar6 = pPVar6 + 1;
      psVar5 = psVar5 + 7;
    } while (size * -0x38 - lVar7 != 0);
  }
  this->data = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(psVar4 + 1);
  return;
}

Assistant:

Array<T>::Array(size_t size) {
    capacity = size;
    data = new T[capacity]();
}